

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O1

String * __thiscall
nigel::AstReturning::returnTypeString_abi_cxx11_
          (String *__return_storage_ptr__,AstReturning *this,BasicType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "byte";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "int";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "unsigned byte";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "unsigned int";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "-!-UNKNOWN-!-";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static String returnTypeString( BasicType type )
		{
			if( type == tByte ) return "byte";
			else if( type == tInt ) return "int";
			else if( type == tUbyte ) return "unsigned byte";
			else if( type == tUint ) return "unsigned int";
			else return "-!-UNKNOWN-!-";
		}